

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O0

CECoordinates * __thiscall
CECoordinates::ConvertTo
          (CECoordinates *this,CECoordinateType output_coord_type,double jd,double longitude,
          double latitude,double elevation_m,double pressure_hPa,double temperature_celsius,
          double relative_humidity,double dut1,double xp,double yp,double wavelength_um)

{
  int in_EDX;
  double in_RSI;
  CECoordinates *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  CECoordinates *in_XMM3_Qa;
  double in_XMM4_Qa;
  double in_XMM5_Qa;
  double in_XMM6_Qa;
  double in_XMM7_Qa;
  double unaff_retaddr;
  CECoordinates *in_stack_00000008;
  CECoordinates *in_stack_00000010;
  double in_stack_00000018;
  double in_stack_00000020;
  CECoordinates *in_stack_00000028;
  double in_stack_00000040;
  double in_stack_00000048;
  double in_stack_00000050;
  CECoordinates *out_coord;
  double in_stack_ffffffffffffff88;
  double in_stack_ffffffffffffff90;
  double in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 uVar1;
  uint in_stack_ffffffffffffffe8;
  CECoordinates *this_00;
  
  uVar1 = 0;
  this_00 = in_RDI;
  CECoordinates(in_RDI);
  if (in_EDX == 0) {
    ConvertToCIRS(in_stack_00000028,in_stack_00000020,in_stack_00000018,(double)in_stack_00000010,
                  (double)in_stack_00000008,unaff_retaddr,(double)this_00,in_RSI,
                  (double)(ulong)in_stack_ffffffffffffffe8,in_stack_00000040,in_stack_00000048,
                  in_stack_00000050);
    operator=(in_stack_00000010,in_stack_00000008);
    ~CECoordinates(in_stack_00000010);
  }
  else if (in_EDX == 1) {
    ConvertToICRS(in_XMM3_Qa,in_XMM4_Qa,in_XMM5_Qa,in_XMM6_Qa,in_XMM7_Qa,
                  (double)CONCAT17(uVar1,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98,
                  in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_XMM0_Qa,
                  (double)CONCAT44(1,in_stack_ffffffffffffffe8),in_RSI);
    operator=(in_stack_00000010,in_stack_00000008);
    ~CECoordinates(in_stack_00000010);
  }
  else if (in_EDX == 2) {
    ConvertToGalactic(in_XMM3_Qa,in_XMM4_Qa,in_XMM5_Qa,in_XMM6_Qa,in_XMM7_Qa,
                      (double)CONCAT17(uVar1,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98,
                      in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_XMM0_Qa,
                      (double)CONCAT44(2,in_stack_ffffffffffffffe8),in_RSI);
    operator=(in_stack_00000010,in_stack_00000008);
    ~CECoordinates(in_stack_00000010);
  }
  else if (in_EDX == 3) {
    ConvertToObserved(this_00,in_RSI,(double)CONCAT44(3,in_stack_ffffffffffffffe8),in_XMM0_Qa,
                      in_XMM1_Qa,in_XMM2_Qa,(double)in_XMM3_Qa,in_XMM4_Qa,in_XMM5_Qa,
                      (double)in_stack_00000010,in_stack_00000018,in_stack_00000020);
    operator=(in_stack_00000010,in_stack_00000008);
    ~CECoordinates(in_stack_00000010);
  }
  return in_RDI;
}

Assistant:

CECoordinates CECoordinates::ConvertTo(CECoordinateType output_coord_type,
                                       double jd,
                                       double longitude,
                                       double latitude,
                                       double elevation_m,
                                       double pressure_hPa,
                                       double temperature_celsius,
                                       double relative_humidity,
                                       double dut1,
                                       double xp, double yp,
                                       double wavelength_um)
{
    // Create return coordinate object
    CECoordinates out_coord;

    // Do conversion to CIRS
    if (output_coord_type == CECoordinateType::CIRS) {
        out_coord = ConvertToCIRS(jd, longitude, latitude,
                                  elevation_m, pressure_hPa,
                                  temperature_celsius, relative_humidity,
                                  dut1, xp, yp, wavelength_um) ;
    } else if (output_coord_type == CECoordinateType::ICRS) {
        out_coord = ConvertToICRS(jd, longitude, latitude,
                                  elevation_m, pressure_hPa,
                                  temperature_celsius, relative_humidity,
                                  dut1, xp, yp, wavelength_um) ;
    } else if (output_coord_type == CECoordinateType::GALACTIC) {
        out_coord = ConvertToGalactic(jd, longitude, latitude,
                                      elevation_m, pressure_hPa,
                                      temperature_celsius, relative_humidity,
                                      dut1, xp, yp, wavelength_um) ;
    } else if (output_coord_type == CECoordinateType::OBSERVED) {
        out_coord = ConvertToObserved(jd, longitude, latitude,
                                      elevation_m, pressure_hPa,
                                      temperature_celsius, relative_humidity,
                                      dut1, xp, yp, wavelength_um) ;
    }

    return out_coord;
}